

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::AdvancedBindingUpdate::Setup(AdvancedBindingUpdate *this)

{
  CallLogWrapper *this_00;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,this->m_vao);
  glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_vbo);
  glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_ebo);
  if (this->pipeline == true) {
    this->m_vsp = 0;
    this->m_fsp = 0;
    glu::CallLogWrapper::glGenProgramPipelines(this_00,1,&this->m_ppo);
  }
  else {
    this->m_ppo = 0;
  }
  return 0;
}

Assistant:

virtual long Setup()
	{
		glGenVertexArrays(2, m_vao);
		glGenBuffers(2, m_vbo);
		glGenBuffers(2, m_ebo);
		if (pipeline)
		{
			m_vsp = m_fsp = 0;
			glGenProgramPipelines(1, &m_ppo);
		}
		else
		{
			m_ppo = 0;
		}
		return NO_ERROR;
	}